

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

void * json_alloc(json_state *state,unsigned_long size,int zero)

{
  ulong uVar1;
  undefined4 in_EDX;
  ulong in_RSI;
  ulong *in_RDI;
  void *local_8;
  
  if (in_RDI[2] - *in_RDI < in_RSI) {
    local_8 = (void *)0x0;
  }
  else if ((in_RDI[3] == 0) ||
          (uVar1 = *in_RDI, *in_RDI = in_RSI + uVar1, in_RSI + uVar1 <= in_RDI[3])) {
    local_8 = (void *)(*(code *)in_RDI[5])(in_RSI,in_EDX,in_RDI[7]);
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static void * json_alloc (json_state * state, unsigned long size, int zero)
{
   if ((state->ulong_max - state->used_memory) < size)
      return 0;

   if (state->settings.max_memory
         && (state->used_memory += size) > state->settings.max_memory)
   {
      return 0;
   }

   return state->settings.mem_alloc (size, zero, state->settings.user_data);
}